

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

void __thiscall
QtMWidgets::Picker::_q_rowsRemoved(Picker *this,QModelIndex *parent,int start,int end)

{
  QAbstractItemModel *pQVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  PickerPrivate *pPVar5;
  ulong uVar6;
  int *piVar7;
  QModelIndex local_90;
  QModelIndex local_78;
  QModelIndex local_60;
  int local_44;
  int local_40;
  int local_3c;
  int index;
  int local_20;
  int local_1c;
  int end_local;
  int start_local;
  QModelIndex *parent_local;
  Picker *this_local;
  
  local_20 = end;
  local_1c = start;
  _end_local = parent;
  parent_local = (QModelIndex *)this;
  pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
           ::operator->(&this->d);
  QPersistentModelIndex::operator_cast_to_QModelIndex
            ((QModelIndex *)&stack0xffffffffffffffc8,&pPVar5->root);
  bVar3 = QModelIndex::operator!=(parent,(QModelIndex *)&stack0xffffffffffffffc8);
  if (!bVar3) {
    QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>::
    operator->(&this->d);
    iVar4 = QPersistentModelIndex::row();
    pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    if (iVar4 == pPVar5->indexBeforeChange) {
      pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(&this->d);
      bVar3 = PickerPrivate::isRowsVisible(pPVar5,local_1c,local_20);
      if (bVar3) {
        QWidget::update();
      }
    }
    else {
      QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>::
      operator->(&this->d);
      uVar6 = QPersistentModelIndex::isValid();
      if (((uVar6 & 1) == 0) && (iVar4 = count(this), iVar4 != 0)) {
        local_40 = count(this);
        local_40 = local_40 + -1;
        pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                 ::operator->(&this->d);
        local_44 = 0;
        piVar7 = qMax<int>(&pPVar5->indexBeforeChange,&local_44);
        piVar7 = qMin<int>(&local_40,piVar7);
        local_3c = *piVar7;
        pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                 ::operator->(&this->d);
        iVar2 = local_3c;
        pQVar1 = pPVar5->model;
        pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                 ::operator->(&this->d);
        iVar4 = pPVar5->modelColumn;
        pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                 ::operator->(&this->d);
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,&pPVar5->root);
        (**(code **)(*(long *)pQVar1 + 0x60))(&local_60,pQVar1,iVar2,iVar4,&local_78);
        pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                 ::operator->(&this->d);
        QPersistentModelIndex::operator=(&pPVar5->topItemIndex,&local_60);
        setCurrentIndex(this,local_3c);
      }
      else {
        QWidget::update();
        pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                 ::operator->(&this->d);
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_90,&pPVar5->currentIndex);
        _q_emitCurrentIndexChanged(this,&local_90);
      }
    }
  }
  return;
}

Assistant:

void
Picker::_q_rowsRemoved( const QModelIndex & parent, int start, int end )
{
	if( parent != d->root )
		return;

	// model has changed the currentIndex
	if( d->currentIndex.row() != d->indexBeforeChange )
	{
		if( !d->currentIndex.isValid() && count() )
		{
			const int index = qMin( count() - 1, qMax( d->indexBeforeChange, 0 ) );
			d->topItemIndex = d->model->index( index, d->modelColumn, d->root );
			setCurrentIndex( index );
			return;
		}

		update();
		_q_emitCurrentIndexChanged( d->currentIndex );
	}
	else if( d->isRowsVisible( start, end ) )
		update();
}